

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O0

void __thiscall
adios2::aggregator::MPIChain::Init
          (MPIChain *this,size_t numAggregators,size_t subStreams,Comm *parentComm)

{
  BufferSTL **__args;
  pointer in_RDX;
  BufferSTL *in_RSI;
  vector<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>,_std::allocator<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>_>_>
  *in_RDI;
  MPIAggregator *unaff_retaddr;
  Comm *in_stack_00000030;
  Comm *in_stack_00000068;
  MPIAggregator *in_stack_00000070;
  MPIChain *in_stack_00000100;
  vector<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>,_std::allocator<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>_>_>
  *pvVar1;
  
  in_RDI[1].
  super__Vector_base<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>,_std::allocator<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = in_RDX;
  if (in_RDX == (pointer)0x0) {
    MPIAggregator::InitCommOnePerNode(in_stack_00000070,in_stack_00000068);
  }
  else {
    pvVar1 = in_RDI;
    MPIAggregator::InitComm((MPIAggregator *)subStreams,(size_t)parentComm,in_stack_00000030);
    MPIAggregator::HandshakeRank(unaff_retaddr,(int)((ulong)pvVar1 >> 0x20));
  }
  HandshakeLinks(in_stack_00000100);
  if (*(int *)&in_RDI[1].
               super__Vector_base<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>,_std::allocator<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage <
      *(int *)((long)&in_RDI[1].
                      super__Vector_base<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>,_std::allocator<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) {
    __args = (BufferSTL **)operator_new(0x58);
    adios2::format::BufferSTL::BufferSTL(in_RSI);
    std::
    vector<std::unique_ptr<adios2::format::Buffer,std::default_delete<adios2::format::Buffer>>,std::allocator<std::unique_ptr<adios2::format::Buffer,std::default_delete<adios2::format::Buffer>>>>
    ::emplace_back<adios2::format::BufferSTL*>(in_RDI,__args);
  }
  return;
}

Assistant:

void MPIChain::Init(const size_t numAggregators, const size_t subStreams,
                    helper::Comm const &parentComm)
{
    /* numAggregators ignored here as BP3/BP4 uses substreams = aggregators */
    m_NumAggregators = subStreams;
    if (subStreams > 0)
    {
        InitComm(subStreams, parentComm);
        HandshakeRank(0);
    }
    else
    {
        InitCommOnePerNode(parentComm);
    }

    HandshakeLinks();

    // add a receiving buffer except for the last rank (only sends)
    if (m_Rank < m_Size)
    {
        m_Buffers.emplace_back(new format::BufferSTL()); // just one for now
    }
}